

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O1

bool Kernel::SortHelper::areSortsValid
               (Term *t0,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *varSorts)

{
  Term *t;
  bool bVar1;
  TermList t_00;
  TermList TVar2;
  ulong uVar3;
  uint *puVar4;
  uint argIndex;
  bool bVar5;
  TermList argSrt;
  TermList varSrt;
  NonVariableIterator sit;
  TermList local_78;
  TermList local_70;
  NonVariableIterator local_68;
  
  NonVariableIterator::NonVariableIterator(&local_68,t0,true);
  bVar5 = local_68._stack._cursor == local_68._stack._stack;
  if (!bVar5) {
    do {
      t_00 = NonVariableIterator::next(&local_68);
      puVar4 = (uint *)((ulong)(*(uint *)(t_00._content + 0xc) & 0xfffffff) * 8 + 0x28 +
                       t_00._content);
      argIndex = 0;
      while ((*puVar4 & 3) != 2) {
        local_78 = getArgSort(t_00._content,argIndex);
        t = *(Term **)puVar4;
        if (((ulong)t & 1) == 0) {
          TVar2 = getResultSort(t);
          if (local_78._content == TVar2._content) goto LAB_005d448d;
LAB_005d4498:
          bVar1 = false;
        }
        else {
          local_70._content = 2;
          bVar1 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::findOrInsert(varSorts,(uint)((ulong)t >> 2),&local_70,&local_78);
          if ((!bVar1) && (local_70._content != local_78._content)) goto LAB_005d4498;
LAB_005d448d:
          argIndex = argIndex + 1;
          puVar4 = puVar4 + -2;
          bVar1 = true;
        }
        if (!bVar1) goto LAB_005d44be;
      }
      bVar5 = local_68._stack._cursor == local_68._stack._stack;
    } while (!bVar5);
  }
LAB_005d44be:
  local_68.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
       (_func_int **)&PTR__NonVariableIterator_00b69ad0;
  if (local_68._stack._stack != (Term **)0x0) {
    uVar3 = local_68._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack._stack;
    }
    else if (uVar3 < 0x11) {
      *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack._stack;
    }
    else if (uVar3 < 0x19) {
      *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack._stack;
    }
    else if (uVar3 < 0x21) {
      *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack._stack;
    }
    else if (uVar3 < 0x31) {
      *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack._stack;
    }
    else if (uVar3 < 0x41) {
      *local_68._stack._stack = (Term *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack._stack;
    }
    else {
      operator_delete(local_68._stack._stack,0x10);
    }
  }
  return bVar5;
}

Assistant:

bool SortHelper::areSortsValid(Term* t0, DHMap<unsigned,TermList>& varSorts)
{
  NonVariableIterator sit(t0,true);
  while (sit.hasNext()) {
    Term* t = sit.next().term();
    int idx = 0;
    TermList* args = t->args();
    while (!args->isEmpty()) {
      TermList argSrt = getArgSort(t,idx);
      TermList arg = *args;
      if (arg.isVar()) {
        TermList varSrt;
        if (!varSorts.findOrInsert(arg.var(), varSrt, argSrt)) {
          //the variable is not new
          if (varSrt != argSrt) {
            return false;
          }
        }
      } else {
        if (argSrt != getResultSort(arg.term())) {
          return false;
        }
      }
      idx++;
      args=args->next();
    }
  }
  return true;
}